

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

string * __thiscall
svg::Fill::toString_abi_cxx11_(string *__return_storage_ptr__,Fill *this,Layout *layout)

{
  string *in_R8;
  allocator local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  Layout *local_20;
  Layout *layout_local;
  Fill *this_local;
  
  local_20 = layout;
  layout_local = (Layout *)this;
  this_local = (Fill *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"fill",&local_1e9);
  Color::toString_abi_cxx11_(&local_220,&this->color,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"",&local_241);
  attribute<std::__cxx11::string>(&local_1c8,(svg *)local_1e8,&local_220,&local_240,in_R8);
  std::operator<<(local_198,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << attribute("fill", color.toString(layout));
            return ss.str();
        }